

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> * __thiscall
kratos::FSM::get_all_child_states
          (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__return_storage_ptr__,
          FSM *this,bool include_extra_state)

{
  bool bVar1;
  reference ppFVar2;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  *__x;
  pair<std::__detail::_Node_iterator<kratos::FSMState_*,_true,_false>,_bool> pVar3;
  FSM *local_158;
  FSM *fsm;
  FSMState *next_state;
  pair<kratos::Var_*,_kratos::FSMState_*> *iter_1;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  *__range2;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  next_states;
  _Node_iterator_base<kratos::FSMState_*,_false> local_100;
  _Node_iterator_base<kratos::FSMState_*,_false> local_f8;
  value_type local_f0;
  FSMState *state;
  element_type *local_d8;
  reference local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>
  *iter;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
  *__range1;
  unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
  visited;
  undefined1 local_70 [8];
  queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
  queue;
  bool include_extra_state_local;
  FSM *this_local;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *result;
  
  queue.c.super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = include_extra_state;
  std::queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>::
  queue<std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>,void>
            ((queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>
              *)local_70);
  visited._M_h._M_single_bucket._7_1_ = 0;
  std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::vector
            (__return_storage_ptr__);
  std::
  unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
  ::unordered_set((unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
                   *)&__range1);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
           ::begin(&this->states_);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
            ::end(&this->states_);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
    local_d0 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>
               ::operator*(&__end1);
    local_d8 = std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(local_d0->second).
                           super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>);
    std::queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>::
    emplace<kratos::FSMState*>
              ((queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>
                *)local_70,&local_d8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>
    ::operator++(&__end1);
  }
  while (bVar1 = std::
                 queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                 ::empty((queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                          *)local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppFVar2 = std::
              queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
              ::front((queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                       *)local_70);
    local_f0 = *ppFVar2;
    std::
    queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::pop((queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
           *)local_70);
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
         ::find((unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
                 *)&__range1,&local_f0);
    local_100._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
         ::end((unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
                *)&__range1);
    bVar1 = std::__detail::operator!=(&local_f8,&local_100);
    if (!bVar1) {
      pVar3 = std::
              unordered_set<kratos::FSMState*,std::hash<kratos::FSMState*>,std::equal_to<kratos::FSMState*>,std::allocator<kratos::FSMState*>>
              ::emplace<kratos::FSMState*const&>
                        ((unordered_set<kratos::FSMState*,std::hash<kratos::FSMState*>,std::equal_to<kratos::FSMState*>,std::allocator<kratos::FSMState*>>
                          *)&__range1,&local_f0);
      next_states.
      super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar3.first.super__Node_iterator_base<kratos::FSMState_*,_false>._M_cur;
      std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
      emplace_back<kratos::FSMState*const&>
                ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
                 __return_storage_ptr__,&local_f0);
      if (local_f0 != (FSMState *)0x0) {
        __x = FSMState::transitions(local_f0);
        std::
        vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ::vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                  *)&__range2,__x);
        __end2 = std::
                 vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                 ::begin((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                          *)&__range2);
        iter_1 = (pair<kratos::Var_*,_kratos::FSMState_*> *)
                 std::
                 vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                 ::end((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                        *)&__range2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
                                           *)&iter_1), bVar1) {
          next_state = (FSMState *)
                       __gnu_cxx::
                       __normal_iterator<std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
                       ::operator*(&__end2);
          fsm = (FSM *)(next_state->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
                       super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
          for (local_158 = FSMState::parent((FSMState *)fsm);
              local_158 != (FSM *)0x0 && local_158 != this; local_158 = parent_fsm(local_158)) {
          }
          if (local_158 == this) {
            std::
            queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>
            ::emplace<kratos::FSMState*&>
                      ((queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>
                        *)local_70,(FSMState **)&fsm);
          }
          else if ((queue.c.
                    super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
            std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
            emplace_back<kratos::FSMState*&>
                      ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
                       __return_storage_ptr__,(FSMState **)&fsm);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
          ::operator++(&__end2);
        }
        std::
        vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ::~vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                   *)&__range2);
      }
    }
  }
  visited._M_h._M_single_bucket._7_1_ = 1;
  std::
  unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
  ::~unordered_set((unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
                    *)&__range1);
  if ((visited._M_h._M_single_bucket._7_1_ & 1) == 0) {
    std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~vector
              (__return_storage_ptr__);
  }
  std::
  queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>::
  ~queue((queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
          *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<FSMState*> FSM::get_all_child_states(bool include_extra_state) const {
    // this is a BFS search
    std::queue<FSMState*> queue;
    std::vector<FSMState*> result;
    std::unordered_set<FSMState*> visited;

    for (auto const& iter : states_) {
        queue.emplace(iter.second.get());
    }
    while (!queue.empty()) {
        auto* const state = queue.front();
        queue.pop();
        if (visited.find(state) != visited.end()) continue;
        visited.emplace(state);
        result.emplace_back(state);
        if (!state) continue;
        auto next_states = state->transitions();
        for (auto const& iter : next_states) {
            auto* next_state = iter.second;
            auto const* fsm = next_state->parent();
            while (fsm && fsm != this) {
                fsm = fsm->parent_fsm();
            }
            if (fsm == this) {
                queue.emplace(next_state);
            } else if (include_extra_state) {
                result.emplace_back(next_state);
            }
        }
    }
    return result;
}